

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int selectExpander(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  u8 uVar4;
  byte bVar5;
  byte bVar6;
  i16 iVar7;
  uint uVar8;
  Parse *pParse;
  sqlite3 *db;
  VTable *pVVar9;
  ExprList *pEVar10;
  SrcList *pSVar11;
  sqlite3 *psVar12;
  Schema *pSVar13;
  Column *pCVar14;
  u32 uVar15;
  int iVar16;
  int iVar17;
  With *pWVar18;
  Cte *pCVar19;
  Table *pTVar20;
  Select *pSVar21;
  CteUse *pPtr;
  void *pvVar22;
  Expr *pEVar23;
  ExprList *pEVar24;
  IdList *pIVar25;
  char *pcVar26;
  ulong uVar27;
  IdList *pIVar28;
  Expr *pEVar29;
  size_t sVar30;
  long lVar31;
  char *pcVar32;
  char *pcVar33;
  uint uVar34;
  uint uVar35;
  With *p_1;
  RenameToken *pRVar36;
  long lVar37;
  ExprList_item *pEVar38;
  SrcItem *pSVar39;
  char cVar40;
  ExprList *pEList;
  Schema **ppSVar41;
  ulong uVar42;
  SrcItem *pSVar43;
  Select *pSVar44;
  ushort uVar45;
  int iVar46;
  IdList_item *pIVar47;
  SrcList *pSVar48;
  bool bVar49;
  bool bVar50;
  int iLeft;
  ExprList *local_118;
  Cte *local_108;
  uint local_fc;
  With *local_f8;
  int local_f0;
  int local_bc;
  Select *local_b8;
  SrcItem *local_b0;
  Select *local_a8;
  SrcList *local_a0;
  Token local_98;
  ExprList *local_88;
  char *local_80;
  Expr *local_78;
  char *local_70;
  ExprList *local_68;
  ExprList_item *local_60;
  SrcItem *local_58;
  SrcItem *local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  pParse = pWalker->pParse;
  db = pParse->db;
  uVar8 = p->selFlags;
  p->selFlags = uVar8 | 0x40;
  if (db->mallocFailed != '\0') {
    return 2;
  }
  if ((uVar8 & 0x40) != 0) {
    return 1;
  }
  if (pWalker->eCode != 0) {
    uVar15 = pParse->nSelect + 1;
    pParse->nSelect = uVar15;
    p->selId = uVar15;
  }
  pEVar24 = p->pEList;
  local_a0 = p->pSrc;
  if ((uVar8 >> 0x15 & 1) != 0 && pParse->pWith != (With *)0x0) {
    if (p->pWith == (With *)0x0) {
      pWVar18 = (With *)sqlite3DbMallocZero(db,0x40);
      p->pWith = pWVar18;
      if (pWVar18 == (With *)0x0) {
        return 2;
      }
    }
    p->pWith->bView = 1;
  }
  pSVar11 = local_a0;
  pWVar18 = p->pWith;
  if ((pWVar18 != (With *)0x0) && (pParse->nErr == 0)) {
    pWVar18->pOuter = pParse->pWith;
    pParse->pWith = pWVar18;
  }
  local_88 = pEVar24;
  sqlite3SrcListAssignCursors(pParse,local_a0);
  pSVar43 = pSVar11->a;
  local_a8 = p;
  local_58 = pSVar43;
  if (0 < pSVar11->nSrc) {
    iVar46 = 0;
    do {
      bVar49 = false;
      if (pSVar43->pTab != (Table *)0x0) goto LAB_0018ff8d;
      pcVar26 = pSVar43->zName;
      if (pcVar26 == (char *)0x0) {
        iVar17 = sqlite3WalkSelect(pWalker,pSVar43->pSelect);
        bVar49 = true;
        if (iVar17 == 0) {
          pSVar21 = pSVar43->pSelect;
          pTVar20 = (Table *)sqlite3DbMallocZero(pParse->db,0x68);
          pSVar43->pTab = pTVar20;
          if (pTVar20 != (Table *)0x0) {
            pTVar20->nTabRef = 1;
            if (pSVar43->zAlias == (char *)0x0) {
              pcVar26 = sqlite3MPrintf(pParse->db,"%!S",pSVar43);
            }
            else {
              pcVar26 = sqlite3DbStrDup(pParse->db,pSVar43->zAlias);
            }
            pTVar20->zName = pcVar26;
            do {
              pSVar44 = pSVar21;
              pSVar21 = pSVar44->pPrior;
            } while (pSVar21 != (Select *)0x0);
            sqlite3ColumnsFromExprList(pParse,pSVar44->pEList,&pTVar20->nCol,&pTVar20->aCol);
            pTVar20->iPKey = -1;
            pTVar20->nRowLogEst = 200;
            pbVar1 = (byte *)((long)&pTVar20->tabFlags + 1);
            *pbVar1 = *pbVar1 | 0x42;
            if (pParse->nErr != 0) goto LAB_0018ff8d;
            goto LAB_001901f2;
          }
        }
      }
      else {
        pWVar18 = pParse->pWith;
        bVar49 = true;
        if ((((pWVar18 == (With *)0x0) || (pParse->nErr != 0)) ||
            (pSVar43->zDatabase != (char *)0x0)) ||
           (uVar45 = *(ushort *)&(pSVar43->fg).field_0x1, (uVar45 >> 9 & 1) != 0)) {
LAB_0019018c:
          bVar50 = false;
        }
        else {
          do {
            if (0 < (long)pWVar18->nCte) {
              lVar37 = 0;
LAB_0019000f:
              lVar31 = 0;
              do {
                bVar5 = pcVar26[lVar31];
                bVar6 = pWVar18->a[lVar37].zName[lVar31];
                if (bVar5 == bVar6) {
                  if ((ulong)bVar5 == 0) goto LAB_00190049;
                }
                else if (""[bVar5] != ""[bVar6]) goto LAB_00190049;
                lVar31 = lVar31 + 1;
              } while( true );
            }
LAB_00190056:
            cVar40 = (pWVar18->bView != 0) * '\x02';
LAB_00190073:
            if (cVar40 != '\0') {
              pCVar19 = local_108;
              if (cVar40 != '\x02') goto LAB_0019016d;
              break;
            }
            pWVar18 = pWVar18->pOuter;
          } while (pWVar18 != (With *)0x0);
          pCVar19 = (Cte *)0x0;
LAB_0019016d:
          if (pCVar19 == (Cte *)0x0) goto LAB_0019018c;
          pcVar32 = pCVar19->zCteErr;
          if (pcVar32 == (char *)0x0) {
            local_108 = pCVar19;
            if ((uVar45 & 4) != 0) {
              pcVar32 = "\'%s\' is not a function";
              goto LAB_00190603;
            }
            psVar12 = pParse->db;
            pTVar20 = (Table *)sqlite3DbMallocZero(psVar12,0x68);
            bVar50 = true;
            if (pTVar20 != (Table *)0x0) {
              pPtr = pCVar19->pUse;
              if (pPtr == (CteUse *)0x0) {
                pPtr = (CteUse *)sqlite3DbMallocZero(psVar12,0x14);
                pCVar19->pUse = pPtr;
                if ((pPtr != (CteUse *)0x0) &&
                   (pvVar22 = sqlite3ParserAddCleanup(pParse,sqlite3DbFree,pPtr),
                   pvVar22 != (void *)0x0)) {
                  pPtr->eM10d = pCVar19->eM10d;
                  goto LAB_0019039a;
                }
                sqlite3DbFreeNN(psVar12,pTVar20);
              }
              else {
LAB_0019039a:
                pSVar43->pTab = pTVar20;
                pTVar20->nTabRef = 1;
                pcVar26 = sqlite3DbStrDup(psVar12,pCVar19->zName);
                pTVar20->zName = pcVar26;
                pTVar20->iPKey = -1;
                pTVar20->nRowLogEst = 200;
                pbVar1 = (byte *)((long)&pTVar20->tabFlags + 1);
                *pbVar1 = *pbVar1 | 0x42;
                pSVar21 = sqlite3SelectDup(psVar12,pCVar19->pSelect,0);
                pSVar43->pSelect = pSVar21;
                if (psVar12->mallocFailed == '\0') {
                  pbVar1 = (byte *)((long)&pSVar21->selFlags + 3);
                  *pbVar1 = *pbVar1 | 4;
                  uVar45 = *(ushort *)&(pSVar43->fg).field_0x1;
                  if ((uVar45 & 2) != 0) {
                    pcVar26 = (pSVar43->u1).zIndexedBy;
                    pcVar32 = "no such index: \"%s\"";
                    goto LAB_00190603;
                  }
                  *(ushort *)&(pSVar43->fg).field_0x1 = uVar45 | 0x100;
                  (pSVar43->u2).pCteUse = pPtr;
                  iVar17 = pPtr->nUse;
                  pPtr->nUse = iVar17 + 1;
                  if ((0 < iVar17) && (pPtr->eM10d == '\x01')) {
                    pPtr->eM10d = '\0';
                  }
                  bVar5 = pSVar21->op;
                  pSVar44 = pSVar21;
                  local_b8 = pSVar21;
                  if ((bVar5 & 0xfe) == 0x86) {
                    iVar17 = -1;
                    do {
                      if (pSVar21->op != pSVar44->op) goto LAB_001905bc;
                      pSVar11 = pSVar21->pSrc;
                      if (0 < pSVar11->nSrc) {
                        lVar37 = 0;
LAB_0019049a:
                        bVar49 = true;
                        if ((pSVar11->a[lVar37].zDatabase == (char *)0x0) &&
                           (pcVar26 = pSVar11->a[lVar37].zName, pcVar26 != (char *)0x0)) {
                          lVar31 = 0;
                          do {
                            bVar6 = pcVar26[lVar31];
                            bVar3 = pCVar19->zName[lVar31];
                            if (bVar6 == bVar3) {
                              if ((ulong)bVar6 == 0) goto LAB_001904e5;
                            }
                            else if (""[bVar6] != ""[bVar3]) goto LAB_001904e5;
                            lVar31 = lVar31 + 1;
                          } while( true );
                        }
                        goto LAB_00190567;
                      }
LAB_0019057a:
                      iVar16 = 3;
                      if ((pSVar21->selFlags & 0x2000) != 0) {
                        pSVar21 = pSVar21->pPrior;
                        iVar16 = 0;
                      }
LAB_001905a6:
                    } while (iVar16 == 0);
                    if (iVar16 != 3) goto LAB_0019060a;
                  }
LAB_001905bc:
                  pCVar19->zCteErr = "circular reference: %s";
                  pWVar18 = pParse->pWith;
                  pParse->pWith = local_f8;
                  if ((pSVar44->selFlags & 0x2000) == 0) {
                    iVar17 = sqlite3WalkSelect(pWalker,pSVar44);
                  }
                  else {
                    pSVar21->pWith = pSVar44->pWith;
                    iVar17 = sqlite3WalkSelect(pWalker,pSVar21);
                    pSVar21->pWith = (With *)0x0;
                  }
                  if (iVar17 == 0) {
                    pParse->pWith = local_f8;
                    pSVar21 = local_b8;
                    do {
                      pSVar44 = pSVar21;
                      pSVar21 = pSVar44->pPrior;
                    } while (pSVar21 != (Select *)0x0);
                    pEVar24 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar44->pEList)->pList;
                    pEVar10 = pCVar19->pCols;
                    pEList = pEVar24;
                    if (((pEVar10 == (ExprList *)0x0) ||
                        (pEList = pEVar10, pEVar24 == (ExprList *)0x0)) ||
                       (pEVar24->nExpr == pEVar10->nExpr)) {
                      sqlite3ColumnsFromExprList(pParse,pEList,&pTVar20->nCol,&pTVar20->aCol);
                      if ((bVar5 & 0xfe) == 0x86) {
                        pcVar26 = "multiple recursive references: %s";
                        if ((local_b8->selFlags >> 0xd & 1) == 0) {
                          pcVar26 = "recursive reference in a subquery: %s";
                        }
                        pCVar19->zCteErr = pcVar26;
                        sqlite3WalkSelect(pWalker,local_b8);
                      }
                      pCVar19->zCteErr = (char *)0x0;
                      pParse->pWith = pWVar18;
                      bVar49 = false;
                      bVar50 = false;
                      goto LAB_0019018e;
                    }
                    sqlite3ErrorMsg(pParse,"table %s has %d values for %d columns",pCVar19->zName);
                    pParse->pWith = pWVar18;
                  }
                  else {
                    pParse->pWith = pWVar18;
                  }
                }
              }
              goto LAB_0019060a;
            }
            bVar49 = false;
          }
          else {
            pcVar26 = pCVar19->zName;
LAB_00190603:
            sqlite3ErrorMsg(pParse,pcVar32,pcVar26);
LAB_0019060a:
            bVar49 = false;
            bVar50 = true;
          }
        }
LAB_0019018e:
        if (bVar49) {
          pTVar20 = sqlite3LocateTableItem(pParse,0,pSVar43);
          pSVar43->pTab = pTVar20;
          bVar49 = true;
          if (pTVar20 != (Table *)0x0) {
            if (pTVar20->nTabRef < 0xffff) {
              pTVar20->nTabRef = pTVar20->nTabRef + 1;
              if ((pTVar20->eTabType == '\x01') || (((pSVar43->fg).field_0x1 & 4) == 0)) {
                if (pTVar20->eTabType != '\0') {
                  bVar5 = (byte)pWalker->eCode;
                  local_108 = (Cte *)CONCAT44(local_108._4_4_,(uint)bVar5);
                  if (((pTVar20->eTabType == '\x01') || (pTVar20->nCol < 1)) &&
                     (iVar17 = viewGetColumnNames(pParse,pTVar20), iVar17 != 0)) goto LAB_0018ff8d;
                  if (pTVar20->eTabType == '\x01') {
                    if (((((pSVar43->fg).field_0x1 & 0x80) != 0) &&
                        (pVVar9 = (pTVar20->u).vtab.p, pVVar9 != (VTable *)0x0)) &&
                       (((uint)db->flags >> 7 & 1) < (uint)pVVar9->eVtabRisk)) {
                      sqlite3ErrorMsg(pParse,"unsafe use of virtual table \"%s\"",pTVar20->zName);
                    }
                  }
                  else if (pTVar20->eTabType == '\x02') {
                    if (((db->flags & 0x80000000) == 0) && (pTVar20->pSchema != db->aDb[1].pSchema))
                    {
                      sqlite3ErrorMsg(pParse,"access to view \"%s\" prohibited",pTVar20->zName);
                    }
                    pSVar21 = sqlite3SelectDup(db,(pTVar20->u).view.pSelect,0);
                    pSVar43->pSelect = pSVar21;
                  }
                  iVar7 = pTVar20->nCol;
                  pTVar20->nCol = -1;
                  pWalker->eCode = 1;
                  sqlite3WalkSelect(pWalker,pSVar43->pSelect);
                  pWalker->eCode = (ushort)bVar5;
                  pTVar20->nCol = iVar7;
                }
LAB_001901f2:
                if (((pSVar43->fg).field_0x1 & 2) != 0) {
                  iVar17 = sqlite3IndexedByLookup(pParse,pSVar43);
                  bVar49 = true;
                  if (iVar17 != 0) goto LAB_0018ff8d;
                }
                bVar49 = false;
              }
              else {
                sqlite3ErrorMsg(pParse,"\'%s\' is not a function",pSVar43->zName);
              }
            }
            else {
              sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar20->zName);
              pSVar43->pTab = (Table *)0x0;
            }
          }
        }
        else {
          bVar49 = true;
          if (!bVar50) goto LAB_001901f2;
        }
      }
LAB_0018ff8d:
      if (bVar49) {
        return 2;
      }
      iVar46 = iVar46 + 1;
      pSVar43 = pSVar43 + 1;
    } while (iVar46 < local_a0->nSrc);
  }
  if (pParse->nErr != 0) {
    return 2;
  }
  pSVar11 = local_a8->pSrc;
  if (1 < pSVar11->nSrc) {
    pSVar43 = pSVar11->a;
    pSVar48 = pSVar11 + 1;
    iVar46 = 0;
    pSVar39 = pSVar43;
    do {
      pTVar20 = (Table *)pSVar48->a[0].zAlias;
      bVar49 = false;
      if (pTVar20 != (Table *)0x0 && pSVar39->pTab != (Table *)0x0) {
        iVar17 = pSVar48->a[0].regReturn;
        uVar15 = ((iVar17 & 0x20) == 0) + 1;
        if ((iVar17 & 4) == 0) {
LAB_0019083a:
          pSVar21 = *(Select **)&pSVar48->a[0].iCursor;
          if ((pSVar48->a[0].regReturn & 0x40000) == 0) {
            bVar49 = false;
            if (pSVar21 != (Select *)0x0) {
              sqlite3SetJoinExpr((Expr *)pSVar21,pSVar48->a[0].regResult,uVar15);
              pSVar21 = local_a8;
              pEVar23 = sqlite3ExprAnd(pParse,local_a8->pWhere,*(Expr **)&pSVar48->a[0].iCursor);
              pSVar21->pWhere = pEVar23;
              bVar49 = false;
              *(undefined8 *)&pSVar48->a[0].iCursor = 0;
              pbVar1 = (byte *)((long)&pSVar48->a[0].regReturn + 2);
              *pbVar1 = *pbVar1 | 8;
            }
          }
          else {
            bVar49 = false;
            iVar17._0_1_ = pSVar21->op;
            iVar17._1_1_ = pSVar21->field_0x1;
            iVar17._2_2_ = pSVar21->nSelectRow;
            if (0 < iVar17) {
              psVar12 = pParse->db;
              lVar37 = 0;
              local_b8 = pSVar21;
              local_b0 = pSVar39;
              do {
                pcVar26 = *(char **)(pSVar21->addrOpenEphm + lVar37 * 4 + -3);
                uVar34 = sqlite3ColumnIndex(pTVar20,pcVar26);
                if (((int)uVar34 < 0) ||
                   (iVar16 = tableAndColumnIndex(pSVar11,0,iVar46,pcVar26,(int *)&local_98,&local_bc
                                                 ,*(ushort *)((long)&pSVar48->a[0].regReturn + 1) >>
                                                  0xc & 1), iVar17 = local_bc, iVar16 == 0)) {
                  sqlite3ErrorMsg(pParse,
                                  "cannot join using column %s - column not present in both tables",
                                  pcVar26);
                  bVar49 = true;
                  pSVar39 = local_b0;
                  goto LAB_00190ce1;
                }
                pEVar23 = sqlite3CreateColumnExpr(psVar12,pSVar11,(int)local_98.z,local_bc);
                if ((pSVar11->a[(int)local_98.z].fg.field_0x2 & 0x20) != 0) {
                  puVar2 = &(pSVar43[(int)local_98.z].pSelect)->pEList->a[iVar17].fg.field_0x1;
                  *(ushort *)puVar2 = *(ushort *)puVar2 | 0x40;
                }
                if ((pSVar11->a[0].fg.jointype & 0x40) != 0) {
                  iVar17 = tableAndColumnIndex(pSVar11,(int)local_98.z + 1,iVar46,pcVar26,
                                               (int *)&local_98,&local_bc,
                                               *(ushort *)((long)&pSVar48->a[0].regReturn + 1) >>
                                               0xc & 1);
                  pEVar24 = (ExprList *)0x0;
                  while (iVar17 != 0) {
                    if (((pSVar11->a[(int)local_98.z].fg.field_0x2 & 4) == 0) ||
                       (iVar17 = sqlite3IdListIndex(pSVar43[(int)local_98.z].u3.pUsing,pcVar26),
                       iVar17 < 0)) {
                      sqlite3ErrorMsg(pParse,"ambiguous reference to %s in USING()",pcVar26);
                      break;
                    }
                    pEVar24 = sqlite3ExprListAppend(pParse,pEVar24,pEVar23);
                    iVar17 = local_bc;
                    pEVar23 = sqlite3CreateColumnExpr(psVar12,pSVar11,(int)local_98.z,local_bc);
                    if ((pSVar11->a[(int)local_98.z].fg.field_0x2 & 0x20) != 0) {
                      puVar2 = &(pSVar43[(int)local_98.z].pSelect)->pEList->a[iVar17].fg.field_0x1;
                      *(ushort *)puVar2 = *(ushort *)puVar2 | 0x40;
                    }
                    iVar17 = tableAndColumnIndex(pSVar11,(int)local_98.z + 1,iVar46,pcVar26,
                                                 (int *)&local_98,&local_bc,
                                                 *(ushort *)((long)&pSVar48->a[0].regReturn + 1) >>
                                                 0xc & 1);
                  }
                  if (pEVar24 != (ExprList *)0x0) {
                    pEVar24 = sqlite3ExprListAppend(pParse,pEVar24,pEVar23);
                    pEVar23 = sqlite3ExprFunction(pParse,pEVar24,
                                                  (Token *)sqlite3ProcessJoin_tkCoalesce,0);
                  }
                }
                pEVar29 = sqlite3CreateColumnExpr(psVar12,pSVar11,iVar46 + 1,uVar34);
                if ((pSVar48->a[0].regReturn & 0x200000) != 0) {
                  puVar2 = &(pSVar48->a[0].pTab)->pCheck->a[uVar34].fg.field_0x1;
                  *(ushort *)puVar2 = *(ushort *)puVar2 | 0x40;
                }
                pEVar23 = sqlite3PExpr(pParse,0x35,pEVar23,pEVar29);
                pSVar44 = local_a8;
                if (pEVar23 != (Expr *)0x0) {
                  pEVar23->flags = pEVar23->flags | uVar15;
                  pEVar23->w = (anon_union_4_2_009eaf8f_for_w)pEVar29->iTable;
                }
                pEVar23 = sqlite3ExprAnd(pParse,local_a8->pWhere,pEVar23);
                pSVar44->pWhere = pEVar23;
                lVar37 = lVar37 + 1;
                iVar16._0_1_ = local_b8->op;
                iVar16._1_1_ = local_b8->field_0x1;
                iVar16._2_2_ = local_b8->nSelectRow;
              } while (lVar37 < iVar16);
              bVar49 = false;
              pSVar39 = local_b0;
            }
          }
        }
        else if (((pSVar48->a[0].regReturn & 0x40000) == 0) &&
                (*(long *)&pSVar48->a[0].iCursor == 0)) {
          local_b0 = pSVar39;
          if (pTVar20->nCol < 1) {
            pIVar28 = (IdList *)0x0;
          }
          else {
            lVar31 = 0;
            lVar37 = 0;
            pIVar28 = (IdList *)0x0;
            do {
              if ((*(byte *)((long)&pTVar20->aCol->colFlags + lVar31) & 2) == 0) {
                pcVar26 = *(char **)((long)&pTVar20->aCol->zCnName + lVar31);
                iVar17 = tableAndColumnIndex(pSVar11,0,iVar46,pcVar26,(int *)0x0,(int *)0x0,1);
                if (iVar17 != 0) {
                  pIVar25 = sqlite3IdListAppend(pParse,pIVar28,(Token *)0x0);
                  pIVar28 = (IdList *)0x0;
                  if (pIVar25 != (IdList *)0x0) {
                    pcVar26 = sqlite3DbStrDup(pParse->db,pcVar26);
                    pIVar25->a[(long)pIVar25->nId + -1].zName = pcVar26;
                    pIVar28 = pIVar25;
                  }
                }
              }
              lVar37 = lVar37 + 1;
              lVar31 = lVar31 + 0x10;
            } while (lVar37 < pTVar20->nCol);
          }
          if (pIVar28 != (IdList *)0x0) {
            pbVar1 = (byte *)((long)&pSVar48->a[0].regReturn + 2);
            *pbVar1 = *pbVar1 | 0x14;
            *(IdList **)&pSVar48->a[0].iCursor = pIVar28;
          }
          bVar49 = true;
          pSVar39 = local_b0;
          if (pParse->nErr == 0) goto LAB_0019083a;
        }
        else {
          sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
          bVar49 = true;
        }
      }
LAB_00190ce1:
      if (bVar49) {
        return 2;
      }
      iVar46 = iVar46 + 1;
      pSVar48 = (SrcList *)&pSVar48->a[0].u2;
      pSVar39 = pSVar39 + 1;
    } while (iVar46 < pSVar11->nSrc + -1);
  }
  uVar27 = (ulong)local_88->nExpr;
  local_fc = 0;
  bVar49 = 0 < (long)uVar27;
  if (0 < (long)uVar27) {
    pEVar38 = local_88->a;
    local_fc = 0;
    uVar42 = 1;
    do {
      pEVar23 = pEVar38->pExpr;
      uVar4 = pEVar23->op;
      if (uVar4 == 0x8d) {
        uVar4 = pEVar23->pRight->op;
      }
      if (uVar4 == 0xb4) {
        if (bVar49) {
          if (0 < local_88->nExpr) {
            local_60 = local_88->a;
            local_48 = (ulong)((uint)pParse->db->flags & 0x44);
            local_50 = (SrcItem *)&local_a0[1].a[0].iCursor;
            lVar37 = 0;
            local_118 = (ExprList *)0x0;
            goto LAB_00190df9;
          }
          local_118 = (ExprList *)0x0;
          goto LAB_001915d6;
        }
        break;
      }
      local_fc = local_fc | pEVar23->flags;
      bVar49 = uVar42 < uVar27;
      pEVar38 = pEVar38 + 1;
      bVar50 = uVar42 != uVar27;
      uVar42 = uVar42 + 1;
    } while (bVar50);
  }
  goto LAB_001915fa;
LAB_00190049:
  if (bVar5 == bVar6) {
    cVar40 = '\x01';
    local_108 = pWVar18->a + lVar37;
    local_f8 = pWVar18;
    goto LAB_00190073;
  }
  lVar37 = lVar37 + 1;
  if (lVar37 == pWVar18->nCte) goto LAB_00190056;
  goto LAB_0019000f;
LAB_001904e5:
  if (bVar6 == bVar3) {
    pSVar11->a[lVar37].pTab = pTVar20;
    pTVar20->nTabRef = pTVar20->nTabRef + 1;
    puVar2 = &pSVar11->a[lVar37].fg.field_0x1;
    *puVar2 = *puVar2 | 0x40;
    if ((pSVar21->selFlags >> 0xd & 1) == 0) {
      pSVar21->selFlags = pSVar21->selFlags | 0x2000;
      if (iVar17 < 0) {
        iVar17 = pParse->nTab;
        pParse->nTab = iVar17 + 1;
      }
      pSVar11->a[lVar37].iCursor = iVar17;
    }
    else {
      bVar49 = false;
      sqlite3ErrorMsg(pParse,"multiple references to recursive table: %s",pCVar19->zName);
      pSVar44 = local_b8;
    }
  }
LAB_00190567:
  if (!bVar49) {
    iVar16 = 1;
    goto LAB_001905a6;
  }
  lVar37 = lVar37 + 1;
  if (pSVar11->nSrc <= lVar37) goto LAB_0019057a;
  goto LAB_0019049a;
LAB_00190fcc:
  if (bVar5 == bVar6) {
LAB_00190fd5:
    if (pTVar20->pSchema == (Schema *)0x0) {
      uVar35 = 0xffff8000;
    }
    else {
      uVar35 = 0xffffffff;
      ppSVar41 = &db->aDb->pSchema;
      do {
        uVar35 = uVar35 + 1;
        pSVar13 = *ppSVar41;
        ppSVar41 = ppSVar41 + 4;
      } while (pSVar13 != pTVar20->pSchema);
    }
    if ((int)uVar35 < 0) {
      pEVar24 = (ExprList *)0x0;
      local_70 = "*";
    }
    else {
      local_70 = db->aDb[uVar35].zDbSName;
      pEVar24 = (ExprList *)0x0;
    }
LAB_0019102f:
    if (((int)(uVar34 + 1) < iVar46) &&
       ((*(byte *)((long)(pSVar43 + 1) + 0x3e) & 4) != 0 && (uVar8 >> 0xb & 1) != 0)) {
      pIVar28 = *(IdList **)((long)(pSVar43 + 1) + 0x48);
      if (0 < pIVar28->nId) {
        pIVar47 = pIVar28->a;
        lVar37 = 0;
        local_80 = pcVar32;
        local_68 = pEVar24;
        do {
          pcVar32 = pIVar47->zName;
          pEVar23 = sqlite3Expr(db,0x3b,pcVar32);
          local_118 = sqlite3ExprListAppend(pParse,local_118,pEVar23);
          if (local_118 != (ExprList *)0x0) {
            lVar31 = (long)local_118->nExpr;
            pcVar32 = sqlite3MPrintf(db,"..%s",pcVar32);
            local_118->a[lVar31 + -1].zEName = pcVar32;
            *(ushort *)&local_118->a[lVar31 + -1].fg.field_0x1 =
                 *(ushort *)&local_118->a[lVar31 + -1].fg.field_0x1 & 0xff7c | 0x82;
          }
          lVar37 = lVar37 + 1;
          pIVar47 = pIVar47 + 1;
          pcVar32 = local_80;
          pEVar24 = local_68;
        } while (lVar37 < pIVar28->nId);
      }
    }
    else {
      pIVar28 = (IdList *)0x0;
    }
    if (0 < pTVar20->nCol) {
      local_b8 = (Select *)pEVar24->a;
      local_38 = (ulong)~uVar34;
      lVar37 = 0;
      local_80 = pcVar32;
      local_68 = pEVar24;
      do {
        pCVar14 = pTVar20->aCol;
        pcVar32 = pCVar14[lVar37].zCnName;
        if (pEVar24 == (ExprList *)0x0 || pcVar26 == (char *)0x0) {
LAB_00191115:
          if ((((local_a8->selFlags & 0x20000) == 0) && ((pCVar14[lVar37].colFlags & 2) != 0)) ||
             ((((uVar8 >> 0xb & 1) == 0 && pcVar26 == (char *)0x0) &
              (*(byte *)((long)&pCVar14[lVar37].colFlags + 1) & 4) >> 2) != 0)) {
            bVar50 = false;
          }
          else {
            if (((((uVar8 >> 0xb & 1) != 0 || pcVar26 != (char *)0x0) || uVar34 == 0) ||
                (((pSVar43->fg).field_0x2 & 4) == 0)) ||
               (iVar46 = sqlite3IdListIndex((pSVar43->u3).pUsing,pcVar32), iVar46 < 0)) {
              pEVar23 = sqlite3Expr(db,0x3b,pcVar32);
              iVar46 = local_a0->nSrc;
              if (iVar46 < 2) {
LAB_0019120a:
                if (1 < pParse->eParseMode) goto LAB_0019121c;
              }
              else {
                if (((((pSVar43->fg).jointype & 0x40) != 0) && ((uVar8 & 0x800) == 0)) &&
                   (0 < (int)local_38 + iVar46)) {
                  iVar46 = iVar46 + local_f0;
                  pSVar39 = local_b0;
                  do {
                    if ((((*(byte *)((long)(pSVar39 + -1) + 0x5e) & 4) != 0) &&
                        (pSVar39->pSchema != (Schema *)0x0)) &&
                       (iVar17 = sqlite3IdListIndex((IdList *)pSVar39->pSchema,pcVar32), -1 < iVar17
                       )) goto LAB_0019120a;
                    iVar46 = iVar46 + -1;
                    pSVar39 = pSVar39 + 1;
                  } while (1 < iVar46);
                }
LAB_0019121c:
                pEVar29 = sqlite3Expr(db,0x3b,local_80);
                pEVar23 = sqlite3PExpr(pParse,0x8d,pEVar29,pEVar23);
                if ((1 < pParse->eParseMode) && (local_78->pLeft != (Expr *)0x0)) {
                  for (pRVar36 = pParse->pRename; pRVar36 != (RenameToken *)0x0;
                      pRVar36 = pRVar36->pNext) {
                    if ((Expr *)pRVar36->p == local_78->pLeft) {
                      pRVar36->p = pEVar29;
                      break;
                    }
                  }
                }
                if (local_70 != (char *)0x0) {
                  local_98.z = local_70;
                  sVar30 = strlen(local_70);
                  local_98.n = (uint)sVar30 & 0x3fffffff;
                  pEVar29 = sqlite3ExprAlloc(db,0x3b,&local_98,0);
                  pEVar23 = sqlite3PExpr(pParse,0x8d,pEVar29,pEVar23);
                }
              }
              local_118 = sqlite3ExprListAppend(pParse,local_118,pEVar23);
              if (local_118 != (ExprList *)0x0) {
                lVar31 = (long)local_118->nExpr;
                if (((uVar8 >> 0xb & 1) == 0) || (1 < pParse->eParseMode)) {
                  if ((int)local_48 == 4) {
                    bVar50 = false;
                    pcVar32 = sqlite3MPrintf(db,"%s.%s",local_80,pcVar32);
                    local_118->a[lVar31 + -1].zEName = pcVar32;
                    puVar2 = &local_118->a[lVar31 + -1].fg.field_0x1;
                    *puVar2 = *puVar2 & 0xfc;
                    goto LAB_0019146d;
                  }
                  pcVar32 = sqlite3DbStrDup(db,pcVar32);
                  local_118->a[lVar31 + -1].zEName = pcVar32;
                  puVar2 = &local_118->a[lVar31 + -1].fg.field_0x1;
                  *puVar2 = *puVar2 & 0xfc;
                }
                else {
                  if (local_68 == (ExprList *)0x0) {
                    pcVar33 = sqlite3MPrintf(db,"%s.%s.%s",local_70,local_80,pcVar32);
                  }
                  else {
                    pcVar33 = sqlite3DbStrDup(db,*(char **)(local_b8->addrOpenEphm + lVar37 * 6 + -3
                                                           ));
                  }
                  local_118->a[lVar31 + -1].zEName = pcVar33;
                  uVar45 = *(ushort *)&local_118->a[lVar31 + -1].fg.field_0x1 & 0xfffc;
                  *(ushort *)&local_118->a[lVar31 + -1].fg.field_0x1 = uVar45 + 2;
                  if ((((((pSVar43->fg).field_0x2 & 4) != 0) &&
                       (iVar46 = sqlite3IdListIndex((pSVar43->u3).pUsing,pcVar32), -1 < iVar46)) ||
                      ((pIVar28 != (IdList *)0x0 &&
                       (iVar46 = sqlite3IdListIndex(pIVar28,pcVar32), -1 < iVar46)))) ||
                     ((pTVar20->aCol[lVar37].colFlags & 0x400) != 0)) {
                    *(ushort *)&local_118->a[lVar31 + -1].fg.field_0x1 = uVar45 | 0x102;
                  }
                }
                goto LAB_0019146a;
              }
              bVar50 = true;
              local_118 = (ExprList *)0x0;
            }
            else {
LAB_0019146a:
              bVar50 = false;
            }
LAB_0019146d:
            bVar49 = true;
          }
        }
        else {
          bVar50 = false;
          iVar46 = sqlite3MatchEName((ExprList_item *)(local_b8->addrOpenEphm + lVar37 * 6 + -5),
                                     (char *)0x0,pcVar26,(char *)0x0);
          if (iVar46 != 0) goto LAB_00191115;
        }
      } while ((!bVar50) && (lVar37 = lVar37 + 1, lVar37 < pTVar20->nCol));
    }
  }
LAB_00190f33:
  if (uVar4 != '\0') goto LAB_00191573;
  uVar34 = uVar34 + 1;
  pSVar43 = pSVar43 + 1;
  iVar46 = local_a0->nSrc;
  local_f0 = local_f0 + -1;
  local_b0 = local_b0 + 1;
  if (iVar46 <= (int)uVar34) goto LAB_00191573;
  goto LAB_00190f12;
LAB_00191573:
  bVar49 = !bVar49;
LAB_0019157f:
  if (bVar49) {
    if (pcVar26 == (char *)0x0) {
      sqlite3ErrorMsg(pParse,"no tables specified");
    }
    else {
      sqlite3ErrorMsg(pParse,"no such table: %s");
    }
  }
  while (lVar37 = local_40 + 1, lVar37 < local_88->nExpr) {
LAB_00190df9:
    local_78 = local_60[lVar37].pExpr;
    local_fc = local_fc | local_78->flags;
    local_40 = lVar37;
    if (local_78->op == 0xb4) {
      pcVar26 = (char *)0x0;
LAB_00190eca:
      iVar46 = local_a0->nSrc;
      if (0 < iVar46) {
        local_f0 = 0;
        local_b0 = local_50;
        uVar34 = 0;
        bVar49 = false;
        pSVar43 = local_58;
LAB_00190f12:
        pcVar32 = pSVar43->zAlias;
        pTVar20 = pSVar43->pTab;
        if (pcVar32 == (char *)0x0) {
          pcVar32 = pTVar20->zName;
        }
        uVar4 = db->mallocFailed;
        if (uVar4 == '\0') {
          if (((pSVar43->fg).field_0x2 & 0x20) == 0) {
            if (pcVar26 != (char *)0x0) {
              lVar37 = 0;
              do {
                bVar5 = pcVar26[lVar37];
                bVar6 = pcVar32[lVar37];
                if (bVar5 == bVar6) {
                  if ((ulong)bVar5 == 0) goto LAB_00190fcc;
                }
                else if (""[bVar5] != ""[bVar6]) goto LAB_00190fcc;
                lVar37 = lVar37 + 1;
              } while( true );
            }
            goto LAB_00190fd5;
          }
          pEVar24 = pSVar43->pSelect->pEList;
          local_70 = (char *)0x0;
          goto LAB_0019102f;
        }
        goto LAB_00190f33;
      }
      bVar49 = true;
      goto LAB_0019157f;
    }
    if ((local_78->op == 0x8d) && (local_78->pRight->op == 0xb4)) {
      pcVar26 = (local_78->pLeft->u).zToken;
      goto LAB_00190eca;
    }
    pEVar38 = local_60 + lVar37;
    local_118 = sqlite3ExprListAppend(pParse,local_118,local_78);
    if (local_118 != (ExprList *)0x0) {
      lVar37 = (long)local_118->nExpr;
      local_118->a[lVar37 + -1].zEName = pEVar38->zEName;
      *(ushort *)&local_118->a[lVar37 + -1].fg.field_0x1 =
           *(ushort *)&local_118->a[lVar37 + -1].fg.field_0x1 & 0xfffc |
           *(ushort *)&(pEVar38->fg).field_0x1 & 3;
      pEVar38->zEName = (char *)0x0;
    }
    pEVar38->pExpr = (Expr *)0x0;
  }
LAB_001915d6:
  exprListDeleteNN(db,local_88);
  local_a8->pEList = local_118;
LAB_001915fa:
  if (local_a8->pEList == (ExprList *)0x0) {
    return 0;
  }
  if (db->aLimit[2] < local_a8->pEList->nExpr) {
    sqlite3ErrorMsg(pParse,"too many columns in result set");
    return 2;
  }
  if ((local_fc & 0x400008) != 0) {
    pbVar1 = (byte *)((long)&local_a8->selFlags + 2);
    *pbVar1 = *pbVar1 | 4;
    return 0;
  }
  return 0;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k, rc;
  SrcList *pTabList;
  ExprList *pEList;
  SrcItem *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;
  u32 elistFlags = 0;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  assert( p->pSrc!=0 );
  if( (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  if( pWalker->eCode ){
    /* Renumber selId because it has been copied from a view */
    p->selId = ++pParse->nSelect;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  if( pParse->pWith && (p->selFlags & SF_View) ){
    if( p->pWith==0 ){
      p->pWith = (With*)sqlite3DbMallocZero(db, sizeof(With));
      if( p->pWith==0 ){
        return WRC_Abort;
      }
    }
    p->pWith->bView = 1;
  }
  sqlite3WithPush(pParse, p->pWith, 0);

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->pTab ) continue;
    assert( pFrom->fg.isRecursive==0 );
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      if( sqlite3ExpandSubquery(pParse, pFrom) ) return WRC_Abort;
#endif
#ifndef SQLITE_OMIT_CTE
    }else if( (rc = resolveFromTermToCte(pParse, pWalker, pFrom))!=0 ){
      if( rc>1 ) return WRC_Abort;
      pTab = pFrom->pTab;
      assert( pTab!=0 );
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_VIRTUALTABLE)
      if( !IsOrdinaryTable(pTab) ){
        i16 nCol;
        u8 eCodeOrig = pWalker->eCode;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        if( IsView(pTab) ){
          if( (db->flags & SQLITE_EnableView)==0
           && pTab->pSchema!=db->aDb[1].pSchema
          ){
            sqlite3ErrorMsg(pParse, "access to view \"%s\" prohibited",
              pTab->zName);
          }
          pFrom->pSelect = sqlite3SelectDup(db, pTab->u.view.pSelect, 0);
        }
#ifndef SQLITE_OMIT_VIRTUALTABLE
        else if( ALWAYS(IsVirtual(pTab))
         && pFrom->fg.fromDDL
         && ALWAYS(pTab->u.vtab.p!=0)
         && pTab->u.vtab.p->eVtabRisk > ((db->flags & SQLITE_TrustedSchema)!=0)
        ){
          sqlite3ErrorMsg(pParse, "unsafe use of virtual table \"%s\"",
                                  pTab->zName);
        }
        assert( SQLITE_VTABRISK_Normal==1 && SQLITE_VTABRISK_High==2 );
#endif
        nCol = pTab->nCol;
        pTab->nCol = -1;
        pWalker->eCode = 1;  /* Turn on Select.selId renumbering */
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pWalker->eCode = eCodeOrig;
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( pFrom->fg.isIndexedBy && sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  assert( db->mallocFailed==0 || pParse->nErr!=0 );
  if( pParse->nErr || sqlite3ProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
    elistFlags |= pE->flags;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      elistFlags |= pE->flags;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zEName = a[k].zEName;
          pNew->a[pNew->nExpr-1].fg.eEName = a[k].fg.eEName;
          a[k].zEName = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;   /* Table for this data source */
          ExprList *pNestedFrom;       /* Result-set of a nested FROM clause */
          char *zTabName;              /* AS name for this data source */
          const char *zSchemaName = 0; /* Schema name for this data source */
          int iDb;                     /* Schema index for this data src */
          IdList *pUsing;              /* USING clause for pFrom[1] */

          if( (zTabName = pFrom->zAlias)==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          assert( (int)pFrom->fg.isNestedFrom == IsNestedFrom(pFrom->pSelect) );
          if( pFrom->fg.isNestedFrom ){
            assert( pFrom->pSelect!=0 );
            pNestedFrom = pFrom->pSelect->pEList;
            assert( pNestedFrom!=0 );
            assert( pNestedFrom->nExpr==pTab->nCol );
          }else{
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            pNestedFrom = 0;
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          if( i+1<pTabList->nSrc
           && pFrom[1].fg.isUsing
           && (selFlags & SF_NestedFrom)!=0
          ){
            int ii;
            pUsing = pFrom[1].u3.pUsing;
            for(ii=0; ii<pUsing->nId; ii++){
              const char *zUName = pUsing->a[ii].zName;
              pRight = sqlite3Expr(db, TK_ID, zUName);
              pNew = sqlite3ExprListAppend(pParse, pNew, pRight);
              if( pNew ){
                struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
                assert( pX->zEName==0 );
                pX->zEName = sqlite3MPrintf(db,"..%s", zUName);
                pX->fg.eEName = ENAME_TAB;
                pX->fg.bUsingTerm = 1;
              }
            }
          }else{
            pUsing = 0;
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zCnName;
            struct ExprList_item *pX; /* Newly added ExprList term */

            assert( zName );
            if( zTName
             && pNestedFrom
             && sqlite3MatchEName(&pNestedFrom->a[j], 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j])
            ){
              continue;
            }
            if( (pTab->aCol[j].colFlags & COLFLAG_NOEXPAND)!=0
             && zTName==0
             && (selFlags & (SF_NestedFrom))==0
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 && (selFlags & SF_NestedFrom)==0 ){
              if( pFrom->fg.isUsing
               && sqlite3IdListIndex(pFrom->u3.pUsing, zName)>=0
              ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            if( (pTabList->nSrc>1
                 && (  (pFrom->fg.jointype & JT_LTORJ)==0
                     || (selFlags & SF_NestedFrom)!=0
                     || !inAnyUsingClause(zName,pFrom,pTabList->nSrc-i-1)
                    )
                )
             || IN_RENAME_OBJECT
            ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( IN_RENAME_OBJECT && pE->pLeft ){
                sqlite3RenameTokenRemap(pParse, pLeft, pE->pLeft);
              }
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            if( pNew==0 ){
              break;  /* OOM */
            }
            pX = &pNew->a[pNew->nExpr-1];
            assert( pX->zEName==0 );
            if( (selFlags & SF_NestedFrom)!=0 && !IN_RENAME_OBJECT ){
              if( pNestedFrom ){
                pX->zEName = sqlite3DbStrDup(db, pNestedFrom->a[j].zEName);
                testcase( pX->zEName==0 );
              }else{
                pX->zEName = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zName);
                testcase( pX->zEName==0 );
              }
              pX->fg.eEName = ENAME_TAB;
              if( (pFrom->fg.isUsing
                   && sqlite3IdListIndex(pFrom->u3.pUsing, zName)>=0)
               || (pUsing && sqlite3IdListIndex(pUsing, zName)>=0)
               || (pTab->aCol[j].colFlags & COLFLAG_NOEXPAND)!=0
              ){
                pX->fg.bNoExpand = 1;
              }
            }else if( longNames ){
              pX->zEName = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
              pX->fg.eEName = ENAME_NAME;
            }else{
              pX->zEName = sqlite3DbStrDup(db, zName);
              pX->fg.eEName = ENAME_NAME;
            }
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
  if( p->pEList ){
    if( p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
      sqlite3ErrorMsg(pParse, "too many columns in result set");
      return WRC_Abort;
    }
    if( (elistFlags & (EP_HasFunc|EP_Subquery))!=0 ){
      p->selFlags |= SF_ComplexResult;
    }
  }
#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x100 ){
    SELECTTRACE(0x100,pParse,p,("After result-set wildcard expansion:\n"));
    sqlite3TreeViewSelect(0, p, 0);
  }
#endif
  return WRC_Continue;
}